

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O0

void __thiscall
OpenMPDefaultmapClause::generateDOT
          (OpenMPDefaultmapClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  OpenMPDefaultmapClauseBehavior OVar2;
  OpenMPDefaultmapClauseCategory OVar3;
  char *pcVar4;
  long lVar5;
  reference ppcVar6;
  allocator<char> local_6f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  string local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_510;
  char **local_508;
  undefined1 local_500 [8];
  string expr_name;
  iterator iStack_4d8;
  int expr_index;
  iterator it;
  vector<const_char_*,_std::allocator<const_char_*>_> *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  string node_id_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  string node_id;
  string parameter_string;
  OpenMPDefaultmapClauseCategory category;
  OpenMPDefaultmapClauseBehavior behavior;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string clause_kind;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string indent;
  string current_line;
  string *parent_node_local;
  int index_local;
  int depth_local;
  ofstream *dot_file_local;
  OpenMPDefaultmapClause *this_local;
  
  std::__cxx11::string::string((string *)(indent.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,(long)depth,'\t',&local_69);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_100,depth);
  std::operator+(&local_e0,"defaultmap_",&local_100);
  std::operator+(&local_c0,&local_e0,"_");
  std::__cxx11::to_string(&local_120,index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &local_c0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&category,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 parent_node);
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&category,
                 "-- ");
  std::operator+(&local_160,&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  std::operator+(&local_140,&local_160,"\n");
  std::__cxx11::string::operator=((string *)(indent.field_2._M_local_buf + 8),(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&category);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::operator<<((ostream *)dot_file,pcVar4);
  std::__cxx11::string::operator+=((string *)local_68,"\t");
  OVar2 = getBehavior(this);
  OVar3 = getCategory(this);
  std::__cxx11::string::string((string *)(node_id.field_2._M_local_buf + 8));
  switch(OVar2) {
  case OMPC_DEFAULTMAP_BEHAVIOR_alloc:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"alloc");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_to:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"to");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_from:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"from");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_tofrom:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"tofrom");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_firstprivate:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"firstprivate");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_none:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"none");
    break;
  case OMPC_DEFAULTMAP_BEHAVIOR_default:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"default");
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_behavior");
    std::operator+(&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_248,&local_268," -- ");
    std::operator+(&local_228,&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_208,&local_228,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_328,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_308,&local_328," [label = \"");
    std::operator+(&local_2e8,&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    std::operator+(&local_2c8,&local_2e8,"\\n ");
    std::operator+(&local_2a8,&local_2c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_288,&local_2a8,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)(node_id_1.field_2._M_local_buf + 8));
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  std::__cxx11::string::clear();
  switch(OVar3) {
  case OMPC_DEFAULTMAP_CATEGORY_scalar:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"scalar");
    break;
  case OMPC_DEFAULTMAP_CATEGORY_aggregate:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"aggregate");
    break;
  case OMPC_DEFAULTMAP_CATEGORY_pointer:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"pointer");
    break;
  case OMPC_DEFAULTMAP_CATEGORY_allocatable:
    std::__cxx11::string::operator=((string *)(node_id.field_2._M_local_buf + 8),"allocatable");
  }
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   "_category");
    std::operator+(&local_3e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_3c8,&local_3e8," -- ");
    std::operator+(&local_3a8,&local_3c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
    std::operator+(&local_388,&local_3a8,"\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   "\t");
    std::operator+(&local_4a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
    std::operator+(&local_488,&local_4a8," [label = \"");
    std::operator+(&local_468,&local_488,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368);
    std::operator+(&local_448,&local_468,"\\n ");
    std::operator+(&local_428,&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&node_id.field_2 + 8));
    std::operator+(&local_408,&local_428,"\"]\n");
    std::__cxx11::string::operator=
              ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&expr);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::operator<<((ostream *)dot_file,pcVar4);
    std::__cxx11::string::~string((string *)local_368);
  }
  it._M_current = (char **)OpenMPClause::getExpressions(&this->super_OpenMPClause);
  if ((vector<const_char_*,_std::allocator<const_char_*>_> *)it._M_current !=
      (vector<const_char_*,_std::allocator<const_char_*>_> *)0x0) {
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    __normal_iterator(&stack0xfffffffffffffb28);
    expr_name.field_2._12_4_ = 0;
    std::__cxx11::string::string((string *)local_500);
    local_508 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                                   (it._M_current);
    iStack_4d8 = (iterator)local_508;
    while( true ) {
      local_510._M_current =
           (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(it._M_current);
      bVar1 = __gnu_cxx::operator!=(&stack0xfffffffffffffb28,&local_510);
      if (!bVar1) break;
      std::operator+(&local_550,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     "_expr");
      std::__cxx11::to_string(&local_570,expr_name.field_2._12_4_);
      std::operator+(&local_530,&local_550,&local_570);
      std::__cxx11::string::operator=((string *)local_500,(string *)&local_530);
      std::__cxx11::string::~string((string *)&local_530);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_550);
      expr_name.field_2._12_4_ = expr_name.field_2._12_4_ + 1;
      std::operator+(&local_5f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      std::operator+(&local_5d0,&local_5f0," -- ");
      std::operator+(&local_5b0,&local_5d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500)
      ;
      std::operator+(&local_590,&local_5b0,"\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_590);
      std::__cxx11::string::~string((string *)&local_590);
      std::__cxx11::string::~string((string *)&local_5b0);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::string::~string((string *)&local_5f0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      std::operator+(&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "\t");
      std::operator+(&local_6b0,&local_6d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500)
      ;
      std::operator+(&local_690,&local_6b0," [label = \"");
      std::operator+(&local_670,&local_690,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500)
      ;
      std::operator+(&local_650,&local_670,"\\n ");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&stack0xfffffffffffffb28);
      pcVar4 = *ppcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,pcVar4,&local_6f1);
      std::operator+(&local_630,&local_650,&local_6f0);
      std::operator+(&local_610,&local_630,"\"]\n");
      std::__cxx11::string::operator=
                ((string *)(indent.field_2._M_local_buf + 8),(string *)&local_610);
      std::__cxx11::string::~string((string *)&local_610);
      std::__cxx11::string::~string((string *)&local_630);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::allocator<char>::~allocator(&local_6f1);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_670);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_6d0);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::operator<<((ostream *)dot_file,pcVar4);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&stack0xfffffffffffffb28,0);
    }
    std::__cxx11::string::~string((string *)local_500);
  }
  std::__cxx11::string::~string((string *)(node_id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(indent.field_2._M_local_buf + 8));
  return;
}

Assistant:

void OpenMPDefaultmapClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "defaultmap_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDefaultmapClauseBehavior behavior = this->getBehavior();
    OpenMPDefaultmapClauseCategory category = this->getCategory();
    std::string parameter_string;
    switch (behavior) {
        case OMPC_DEFAULTMAP_BEHAVIOR_alloc:
            parameter_string = "alloc";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_to:
            parameter_string = "to";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_from:
            parameter_string = "from";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_tofrom:
            parameter_string = "tofrom";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_firstprivate:
            parameter_string = "firstprivate";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_none:
            parameter_string = "none";
            break;
        case OMPC_DEFAULTMAP_BEHAVIOR_default:
            parameter_string = "default";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_behavior";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };
    parameter_string.clear();
    switch (category) {
        case OMPC_DEFAULTMAP_CATEGORY_scalar:
            parameter_string = "scalar";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_aggregate:
            parameter_string  = "aggregate";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_pointer:
            parameter_string = "pointer";
            break;
        case OMPC_DEFAULTMAP_CATEGORY_allocatable:
            parameter_string = "allocatable";
            break;
        default:
            ;
    };

    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_category";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

   std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
}